

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O3

void __thiscall script_p2sh_tests::set::test_method(set *this)

{
  _func_int **pp_Var1;
  pointer pCVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  lazy_ostream *assertion_descr;
  pointer *this_00;
  int i;
  iterator in_R8;
  iterator pvVar6;
  string *reason_00;
  iterator in_R9;
  iterator pvVar7;
  CKey *this_01;
  undefined8 *puVar8;
  direct_or_indirect *other;
  direct_or_indirect *pdVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  CMutableTransaction txFrom;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  SignatureData empty;
  CMutableTransaction txTo [4];
  string reason;
  CScript outer [4];
  CScript inner [4];
  CKey key [4];
  FillableSigningProvider keystore;
  check_type cVar10;
  char *local_8f0;
  char *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  assertion_result local_880;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  int local_844;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  CMutableTransaction local_810;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  vector<CPubKey,_std::allocator<CPubKey>_> local_778;
  string local_758;
  undefined1 local_738 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  CTransaction local_718;
  undefined1 local_698 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_680 [2];
  direct_or_indirect local_650 [4];
  _Rb_tree_node_base local_5d0;
  size_t local_5b0;
  bool local_540;
  _Rb_tree_node_base local_530;
  size_t local_510;
  _Rb_tree_node_base local_500;
  size_t local_4e0;
  pointer puStack_4d8;
  pointer local_4d0;
  pointer puStack_4c8;
  _Rb_tree_node_base local_4b8;
  size_t local_498;
  _Rb_tree_node_base local_488;
  size_t local_468;
  _Rb_tree_node_base local_458;
  size_t local_438;
  pointer pCStack_430;
  pointer local_428;
  pointer pCStack_420;
  pointer local_418;
  pointer pCStack_410;
  pointer local_408;
  uchar auStack_400 [64];
  _Rb_tree_node_base local_3c0;
  size_t local_3a0;
  _Rb_tree_node_base local_390;
  size_t local_370;
  _Rb_tree_node_base local_360;
  size_t local_340;
  _Rb_tree_node_base local_330;
  size_t local_310;
  undefined1 local_308 [24];
  undefined8 uStack_2f0;
  pointer local_248 [4];
  string local_228;
  direct_or_indirect local_208;
  uint auStack_1ec [25];
  direct_or_indirect local_188;
  uint uStack_16c;
  pointer local_168;
  uint uStack_160;
  undefined4 uStack_15c;
  size_type local_158;
  undefined4 uStack_154;
  undefined8 uStack_150;
  pointer local_148;
  uint uStack_140;
  undefined4 uStack_13c;
  size_type local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  uint uStack_12c;
  pointer local_128;
  uint uStack_120;
  undefined4 uStack_11c;
  size_type local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  uint uStack_10c;
  CKey local_108 [4];
  FillableSigningProvider local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_01399e20;
  lVar5 = 0;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  do {
    (&local_108[0].fCompressed)[lVar5] = false;
    *(undefined8 *)
     ((long)&local_108[0].keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + lVar5)
         = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (CPubKey *)0x0;
  local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (CPubKey *)0x0;
  local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (CPubKey *)0x0;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve(&local_778,4);
  other = &local_188;
  lVar5 = 0;
  do {
    this_01 = (CKey *)(&local_108[0].fCompressed + lVar5);
    CKey::MakeNewKey(this_01,true);
    local_788 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_780 = "";
    local_798 = &boost::unit_test::basic_cstring<char_const>::null;
    local_790 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xab;
    file.m_begin = (iterator)&local_788;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_798,msg);
    CKey::GetPubKey((CPubKey *)local_698,this_01);
    iVar4 = (*local_c8.super_SigningProvider._vptr_SigningProvider[10])
                      (&local_c8,this_01,(lazy_ostream *)local_698);
    local_308[0] = (char)iVar4;
    local_308._8_4_ = 0;
    local_308[0xc] = '\0';
    local_308[0xd] = '\0';
    local_308[0xe] = '\0';
    local_308[0xf] = '\0';
    local_308[0x10] = '\0';
    local_308[0x11] = '\0';
    local_308[0x12] = '\0';
    local_308[0x13] = '\0';
    local_308[0x14] = '\0';
    local_308[0x15] = '\0';
    local_308[0x16] = '\0';
    local_308[0x17] = '\0';
    local_188.indirect_contents.indirect = "keystore.AddKey(key[i])";
    local_188.indirect_contents.capacity = 0xe8b090;
    local_188._12_4_ = 0;
    local_698._8_4_ = local_698._8_4_ & 0xffffff00;
    local_698._0_8_ = &PTR__lazy_ostream_01389048;
    local_698._16_4_ = 0x139d138;
    local_698._20_4_ = 0;
    local_7a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_7a0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)other;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_308,(lazy_ostream *)local_698,1,0,WARN,_cVar10,
               (size_t)&local_7a8,0xab);
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 0x10));
    CKey::GetPubKey((CPubKey *)local_698,this_01);
    pCVar2 = local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CPubKey,_std::allocator<CPubKey>_>::_M_realloc_insert<CPubKey>
                (&local_778,
                 (iterator)
                 local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_finish,(CPubKey *)local_698);
    }
    else {
      memcpy(local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish,(lazy_ostream *)local_698,0x41);
      local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar2 + 1;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  local_118 = 0;
  uStack_114 = 0;
  uStack_110 = 0;
  uStack_10c = 0;
  local_128 = (pointer)0x0;
  uStack_120 = 0;
  uStack_11c = 0;
  local_138 = 0;
  uStack_134 = 0;
  uStack_130 = 0;
  uStack_12c = 0;
  local_148 = (pointer)0x0;
  uStack_140 = 0;
  uStack_13c = 0;
  local_158 = 0;
  uStack_154 = 0;
  uStack_150._0_4_ = 0;
  uStack_150._4_4_ = 0;
  local_168 = (pointer)0x0;
  uStack_160 = 0;
  uStack_15c = 0;
  local_188._16_4_ = 0;
  local_188._20_4_ = 0;
  local_188._24_4_ = 0;
  uStack_16c = 0;
  local_188.indirect_contents.indirect = (char *)0x0;
  local_188.indirect_contents.capacity = 0;
  local_188._12_4_ = 0;
  CKey::GetPubKey((CPubKey *)local_308,local_108);
  PKHash::PKHash((PKHash *)&local_718,(CPubKey *)local_308);
  local_698._16_4_ =
       (size_type)
       local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_698._0_8_ =
       local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_698._8_4_ =
       SUB84(local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_698._12_4_ =
       (undefined4)
       ((ulong)local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x20);
  local_650[0].direct[0] = '\x02';
  GetScriptForDestination((CScript *)&local_208.indirect_contents,(CTxDestination *)local_698);
  if (0x1c < uStack_16c) {
    free(local_188.indirect_contents.indirect);
  }
  local_188.indirect_contents.indirect = local_208.indirect_contents.indirect;
  uStack_16c = auStack_1ec[0];
  auStack_1ec[0] = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_698);
  std::vector<CPubKey,std::allocator<CPubKey>>::
  vector<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,void>
            ((vector<CPubKey,std::allocator<CPubKey>> *)local_308,
             (__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>)
             local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start + 2,(allocator_type *)&local_208.indirect_contents);
  GetScriptForMultisig
            ((CScript *)local_698,2,(vector<CPubKey,_std::allocator<CPubKey>_> *)local_308);
  pdVar9 = (direct_or_indirect *)
           avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0x1c < uStack_150._4_4_) {
    free(local_168);
    pdVar9 = (direct_or_indirect *)
             avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = SUB84(pdVar9,0);
  local_158 = local_698._16_4_;
  uStack_154 = local_698._20_4_;
  local_168 = (pointer)local_698._0_8_;
  uStack_160 = local_698._8_4_;
  uStack_15c = local_698._12_4_;
  avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start._4_4_ = 0;
  uStack_150 = pdVar9;
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,
                    CONCAT44(local_308._20_4_,local_308._16_4_) - local_308._0_8_);
  }
  std::vector<CPubKey,std::allocator<CPubKey>>::
  vector<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,void>
            ((vector<CPubKey,std::allocator<CPubKey>> *)local_308,
             (__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>)
             local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start + 2,(allocator_type *)&local_208.indirect_contents);
  GetScriptForMultisig
            ((CScript *)local_698,1,(vector<CPubKey,_std::allocator<CPubKey>_> *)local_308);
  if (0x1c < uStack_12c) {
    free(local_148);
  }
  local_138 = local_698._16_4_;
  uStack_134 = local_698._20_4_;
  uStack_130 = avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._0_4_;
  local_148 = (pointer)local_698._0_8_;
  uStack_140 = local_698._8_4_;
  uStack_13c = local_698._12_4_;
  uStack_12c = avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
  avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start._4_4_ = 0;
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,
                    CONCAT44(local_308._20_4_,local_308._16_4_) - local_308._0_8_);
  }
  pdVar9 = &local_208;
  std::vector<CPubKey,std::allocator<CPubKey>>::
  vector<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,void>
            ((vector<CPubKey,std::allocator<CPubKey>> *)local_308,
             (__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>)
             local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start + 3,(allocator_type *)&pdVar9->indirect_contents);
  GetScriptForMultisig
            ((CScript *)local_698,2,(vector<CPubKey,_std::allocator<CPubKey>_> *)local_308);
  if (0x1c < uStack_10c) {
    free(local_128);
  }
  local_118 = local_698._16_4_;
  uStack_114 = local_698._20_4_;
  uStack_110 = avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._0_4_;
  local_128 = (pointer)local_698._0_8_;
  uStack_120 = local_698._8_4_;
  uStack_11c = local_698._12_4_;
  uStack_10c = avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
  avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start._4_4_ = 0;
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,
                    CONCAT44(local_308._20_4_,local_308._16_4_) - local_308._0_8_);
  }
  auStack_1ec[0x15] = 0;
  auStack_1ec[0x16] = 0;
  auStack_1ec[0x17] = 0;
  auStack_1ec[0x18] = 0;
  auStack_1ec[0x11] = 0;
  auStack_1ec[0x12] = 0;
  auStack_1ec[0x13] = 0;
  auStack_1ec[0x14] = 0;
  auStack_1ec[0xd] = 0;
  auStack_1ec[0xe] = 0;
  auStack_1ec[0xf] = 0;
  auStack_1ec[0x10] = 0;
  auStack_1ec[9] = 0;
  auStack_1ec[10] = 0;
  auStack_1ec[0xb] = 0;
  auStack_1ec[0xc] = 0;
  auStack_1ec[5] = 0;
  auStack_1ec[6] = 0;
  auStack_1ec[7] = 0;
  auStack_1ec[8] = 0;
  auStack_1ec[1] = 0;
  auStack_1ec[2] = 0;
  auStack_1ec[3] = 0;
  auStack_1ec[4] = 0;
  local_208._16_4_ = 0;
  local_208._20_4_ = 0;
  local_208._24_4_ = 0;
  auStack_1ec[0] = 0;
  local_208.indirect_contents.indirect = (char *)0x0;
  local_208.indirect_contents.capacity = 0;
  local_208._12_4_ = 0;
  lVar5 = 0;
  do {
    ScriptHash::ScriptHash((ScriptHash *)&local_718,(CScript *)((long)&local_188 + lVar5));
    local_698._16_4_ =
         (size_type)
         local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_698._0_8_ =
         local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_698._8_4_ =
         SUB84(local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish,0);
    local_698._12_4_ =
         (undefined4)
         ((ulong)local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish >> 0x20);
    local_650[0].direct[0] = '\x03';
    GetScriptForDestination((CScript *)local_308,(CTxDestination *)local_698);
    puVar8 = (undefined8 *)((long)auStack_1ec + lVar5 + -0x1c);
    if (0x1c < *(uint *)((long)auStack_1ec + lVar5)) {
      free((void *)*puVar8);
    }
    *(ulong *)((long)auStack_1ec + lVar5 + -0x10) = CONCAT44(local_308._16_4_,local_308._12_4_);
    *(ulong *)((long)auStack_1ec + lVar5 + -8) = CONCAT44((undefined4)uStack_2f0,local_308._20_4_);
    *puVar8 = local_308._0_8_;
    *(ulong *)((long)auStack_1ec + lVar5 + -0x14) = CONCAT44(local_308._12_4_,local_308._8_4_);
    *(size_type *)((long)auStack_1ec + lVar5) = uStack_2f0._4_4_;
    uStack_2f0._4_4_ = 0;
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_698);
    local_7b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_7b0 = "";
    local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xb9;
    file_00.m_begin = (iterator)&local_7b8;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_7c8,
               msg_00);
    bVar3 = FillableSigningProvider::AddCScript(&local_c8,(CScript *)((long)&local_188 + lVar5));
    local_308[0] = bVar3;
    local_308._8_4_ = 0;
    local_308[0xc] = '\0';
    local_308[0xd] = '\0';
    local_308[0xe] = '\0';
    local_308[0xf] = '\0';
    local_308[0x10] = '\0';
    local_308[0x11] = '\0';
    local_308[0x12] = '\0';
    local_308[0x13] = '\0';
    local_308[0x14] = '\0';
    local_308[0x15] = '\0';
    local_308[0x16] = '\0';
    local_308[0x17] = '\0';
    local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xea3782;
    local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xea379f;
    local_698._8_4_ = local_698._8_4_ & 0xffffff00;
    local_698._0_8_ = &PTR__lazy_ostream_01389048;
    local_698._16_4_ = 0x139d138;
    local_698._20_4_ = 0;
    local_7d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_7d0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_718;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_308,(lazy_ostream *)local_698,1,0,WARN,_cVar10,
               (size_t)&local_7d8,0xb9);
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 0x10));
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x80);
  CMutableTransaction::CMutableTransaction(&local_810);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_810.vout,4);
  lVar5 = 8;
  do {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(local_810.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar5),
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&pdVar9->indirect_contents);
    *(undefined8 *)
     ((long)local_810.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start + lVar5 + -8) = 1000000;
    pdVar9 = (direct_or_indirect *)((long)pdVar9 + 0x20);
    lVar5 = lVar5 + 0x28;
  } while (lVar5 != 0xa8);
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xc4;
  file_01.m_begin = (iterator)&local_820;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_830,
             msg_01);
  CTransaction::CTransaction((CTransaction *)local_698,&local_810);
  bVar3 = IsStandardTx((CTransaction *)local_698,&local_228);
  local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
  local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_738._0_8_ = "IsStandardTx(CTransaction(txFrom), reason)";
  local_738._8_8_ = "";
  assertion_descr = (lazy_ostream *)local_308;
  local_308._8_4_ = local_308._8_4_ & 0xffffff00;
  local_308._0_8_ = &PTR__lazy_ostream_01389048;
  local_308[0x10] = '8';
  local_308[0x11] = 0xd1;
  local_308[0x12] = '9';
  local_308[0x13] = '\x01';
  local_308[0x14] = '\0';
  local_308[0x15] = '\0';
  local_308[0x16] = '\0';
  local_308[0x17] = '\0';
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_838 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  uStack_2f0 = (pointer)local_738;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_718,assertion_descr,1,0,WARN,_cVar10,(size_t)&local_840,0xc4
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_680);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_698);
  lVar5 = 0;
  do {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)(local_308 + lVar5));
    lVar5 = lVar5 + 0x38;
  } while (lVar5 != 0xe0);
  lVar5 = 0;
  do {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)assertion_descr,1);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)&assertion_descr[1].m_empty,1);
    *(int *)(assertion_descr->_vptr_lazy_ostream + 4) = (int)lVar5;
    CMutableTransaction::GetHash((Txid *)local_698,&local_810);
    pp_Var1 = assertion_descr->_vptr_lazy_ostream;
    pp_Var1[2] = (_func_int *)CONCAT44(local_698._20_4_,local_698._16_4_);
    pp_Var1[3] = (_func_int *)
                 avStack_680[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
    *pp_Var1 = (_func_int *)local_698._0_8_;
    pp_Var1[1] = (_func_int *)CONCAT44(local_698._12_4_,local_698._8_4_);
    puVar8 = *(undefined8 **)&assertion_descr[1].m_empty;
    *puVar8 = 1000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(puVar8 + 1),
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&other->indirect_contents);
    lVar5 = lVar5 + 1;
    other = (direct_or_indirect *)((long)other + 0x20);
    assertion_descr = (lazy_ostream *)&assertion_descr[3].m_empty;
  } while (lVar5 != 4);
  local_844 = 0;
  do {
    local_698._0_8_ = local_698._0_8_ & 0xffffffffffff0000;
    local_5d0._M_color = _S_red;
    local_5d0._M_parent = (_Base_ptr)0x0;
    memset(local_698 + 8,0,0xb8);
    local_5d0._M_left = &local_5d0;
    local_5b0 = 0;
    local_540 = false;
    local_530._M_color = _S_red;
    local_530._M_parent = (_Base_ptr)0x0;
    local_530._M_left = &local_530;
    local_510 = 0;
    local_500._M_color = _S_red;
    local_500._M_parent = (_Base_ptr)0x0;
    local_500._M_left = &local_500;
    local_4b8._M_color = _S_red;
    local_4b8._M_parent = (_Base_ptr)0x0;
    local_4e0 = 0;
    puStack_4d8 = (pointer)0x0;
    local_4d0 = (pointer)0x0;
    puStack_4c8 = (pointer)0x0;
    local_4b8._M_left = &local_4b8;
    local_498 = 0;
    local_488._M_color = _S_red;
    local_488._M_parent = (_Base_ptr)0x0;
    local_488._M_left = &local_488;
    local_468 = 0;
    local_458._M_color = _S_red;
    local_458._M_parent = (_Base_ptr)0x0;
    local_458._M_left = &local_458;
    local_3c0._M_color = _S_red;
    local_3c0._M_parent = (_Base_ptr)0x0;
    local_438 = 0;
    pCStack_430 = (pointer)0x0;
    local_428 = (pointer)0x0;
    pCStack_420 = (pointer)0x0;
    local_418 = (pointer)0x0;
    pCStack_410 = (pointer)0x0;
    local_408 = (pointer)0x0;
    auStack_400[0] = '\0';
    auStack_400[1] = '\0';
    auStack_400[2] = '\0';
    auStack_400[3] = '\0';
    auStack_400[4] = '\0';
    auStack_400[5] = '\0';
    auStack_400[6] = '\0';
    auStack_400[7] = '\0';
    auStack_400[8] = '\0';
    auStack_400[9] = '\0';
    auStack_400[10] = '\0';
    auStack_400[0xb] = '\0';
    auStack_400[0xc] = '\0';
    auStack_400[0xd] = '\0';
    auStack_400[0xe] = '\0';
    auStack_400[0xf] = '\0';
    auStack_400[0x10] = '\0';
    auStack_400[0x11] = '\0';
    auStack_400[0x12] = '\0';
    auStack_400[0x13] = '\0';
    auStack_400[0x14] = '\0';
    auStack_400[0x15] = '\0';
    auStack_400[0x16] = '\0';
    auStack_400[0x17] = '\0';
    auStack_400[0x18] = '\0';
    auStack_400[0x19] = '\0';
    auStack_400[0x1a] = '\0';
    auStack_400[0x1b] = '\0';
    auStack_400[0x1c] = '\0';
    auStack_400[0x1d] = '\0';
    auStack_400[0x1e] = '\0';
    auStack_400[0x1f] = '\0';
    auStack_400[0x20] = '\0';
    auStack_400[0x21] = '\0';
    auStack_400[0x22] = '\0';
    auStack_400[0x23] = '\0';
    auStack_400[0x24] = '\0';
    auStack_400[0x25] = '\0';
    auStack_400[0x26] = '\0';
    auStack_400[0x27] = '\0';
    auStack_400[0x28] = '\0';
    auStack_400[0x29] = '\0';
    auStack_400[0x2a] = '\0';
    auStack_400[0x2b] = '\0';
    auStack_400[0x2c] = '\0';
    auStack_400[0x2d] = '\0';
    auStack_400[0x2e] = '\0';
    auStack_400[0x2f] = '\0';
    auStack_400[0x30] = '\0';
    auStack_400[0x31] = '\0';
    auStack_400[0x32] = '\0';
    auStack_400[0x33] = '\0';
    local_3c0._M_left = &local_3c0;
    local_3a0 = 0;
    local_390._M_color = _S_red;
    local_390._M_parent = (_Base_ptr)0x0;
    local_390._M_left = &local_390;
    local_370 = 0;
    local_360._M_color = _S_red;
    local_360._M_parent = (_Base_ptr)0x0;
    local_360._M_left = &local_360;
    local_340 = 0;
    local_330._M_color = _S_red;
    local_330._M_parent = (_Base_ptr)0x0;
    local_330._M_left = &local_330;
    local_310 = 0;
    local_858 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_850 = "";
    local_868 = &boost::unit_test::basic_cstring<char_const>::null;
    local_860 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0xd3;
    file_02.m_begin = (iterator)&local_858;
    msg_02.m_end = pvVar7;
    msg_02.m_begin = pvVar6;
    local_5d0._M_right = local_5d0._M_left;
    local_530._M_right = local_530._M_left;
    local_500._M_right = local_500._M_left;
    local_4b8._M_right = local_4b8._M_left;
    local_488._M_right = local_488._M_left;
    local_458._M_right = local_458._M_left;
    local_3c0._M_right = local_3c0._M_left;
    local_390._M_right = local_390._M_left;
    local_360._M_right = local_360._M_left;
    local_330._M_right = local_330._M_left;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_868,
               msg_02);
    CTransaction::CTransaction(&local_718,&local_810);
    local_880.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         SignSignature(&local_c8.super_SigningProvider,&local_718,
                       (CMutableTransaction *)(local_308 + (long)local_844 * 0x38),0,1,
                       (SignatureData *)local_698);
    local_880.m_message.px = (element_type *)0x0;
    local_880.m_message.pn.pi_ = (sp_counted_base *)0x0;
    tinyformat::format<int>(&local_758,"SignSignature %d",&local_844);
    local_738._8_8_ = local_738._8_8_ & 0xffffffffffffff00;
    local_738._0_8_ = &PTR__lazy_ostream_01388e08;
    local_728._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_890 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_888 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x1;
    local_728._8_8_ = &local_758;
    boost::test_tools::tt_detail::report_assertion
              (&local_880,(lazy_ostream *)local_738,1,1,WARN,_cVar10,(size_t)&local_890,0xd3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count(&local_880.m_message.pn);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_718.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_718.vin);
    local_8a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_898 = "";
    local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0xd4;
    file_03.m_begin = (iterator)&local_8a0;
    msg_03.m_end = pvVar7;
    msg_03.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_8b0,
               msg_03);
    CTransaction::CTransaction
              (&local_718,(CMutableTransaction *)(local_308 + (long)local_844 * 0x38));
    local_738[4] = 0;
    local_758._M_dataplus._M_p = (pointer)0xbb8;
    local_880.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         IsStandardTx(&local_718,(optional<unsigned_int> *)local_738,true,(CFeeRate *)&local_758,
                      &local_228);
    local_880.m_message.px = (element_type *)0x0;
    local_880.m_message.pn.pi_ = (sp_counted_base *)0x0;
    tinyformat::format<int>(&local_758,"txTo[%d].IsStandard",&local_844);
    local_738._8_8_ = local_738._8_8_ & 0xffffffffffffff00;
    local_738._0_8_ = &PTR__lazy_ostream_01388e08;
    local_728._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_8c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_8b8 = "";
    pvVar6 = (iterator)0x1;
    local_728._8_8_ = &local_758;
    boost::test_tools::tt_detail::report_assertion
              (&local_880,(lazy_ostream *)local_738,1,1,WARN,_cVar10,(size_t)&local_8c0,0xd4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count(&local_880.m_message.pn);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_718.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_718.vin);
    CTransaction::CTransaction
              (&local_718,(CMutableTransaction *)(local_308 + (long)local_844 * 0x38));
    local_738[4] = 0;
    local_758._M_dataplus._M_p = (pointer)0xbb8;
    reason_00 = &local_228;
    bVar3 = IsStandardTx(&local_718,(optional<unsigned_int> *)local_738,false,(CFeeRate *)&local_758
                         ,reason_00);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_718.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_718.vin);
    local_8d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_8c8 = "";
    local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0xd6;
    file_04.m_begin = (iterator)&local_8d0;
    msg_04.m_end = pvVar6;
    msg_04.m_begin = (iterator)reason_00;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_8e0,
               msg_04);
    local_758._M_dataplus._M_p._0_1_ = bVar3 != (local_844 != 0);
    local_758._M_string_length = 0;
    local_758.field_2._M_allocated_capacity = 0;
    tinyformat::format<int>
              ((string *)local_738,"txTo[%d].IsStandard(permbaremulti=false)",&local_844);
    local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_01388e08;
    local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_8f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_8e8 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x1;
    local_718.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_738;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_758,(lazy_ostream *)&local_718,1,1,WARN,_cVar10,
               (size_t)&local_8f0,0xd6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_738._0_8_ != &local_728) {
      operator_delete((void *)local_738._0_8_,(ulong)(local_728._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_758.field_2._M_allocated_capacity);
    SignatureData::~SignatureData((SignatureData *)local_698);
    iVar4 = local_844 + 1;
    bVar3 = local_844 < 3;
    local_844 = iVar4;
  } while (bVar3);
  lVar5 = -0xe0;
  this_00 = local_248;
  do {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)this_00);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)(this_00 + -3));
    this_00 = this_00 + -7;
    lVar5 = lVar5 + 0x38;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_810.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_810.vin);
  lVar5 = 0x60;
  do {
    if (0x1c < *(uint *)((long)auStack_1ec + lVar5)) {
      free(*(void **)((long)auStack_1ec + lVar5 + -0x1c));
      *(undefined8 *)((long)auStack_1ec + lVar5 + -0x1c) = 0;
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x60;
  do {
    if (0x1c < *(uint *)((long)&uStack_16c + lVar5)) {
      free(*(void **)((long)&local_188 + lVar5));
      *(undefined8 *)((long)&local_188 + lVar5) = 0;
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  if (local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
      super__Vector_impl_data._M_start != (CPubKey *)0x0) {
    operator_delete(local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_778.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar5 = 0x38;
  do {
    if (*(array<unsigned_char,_32UL> **)(&local_108[0].fCompressed + lVar5) !=
        (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
                 (&local_108[0].fCompressed + lVar5),
                 *(array<unsigned_char,_32UL> **)(&local_108[0].fCompressed + lVar5));
    }
    *(undefined8 *)(&local_108[0].fCompressed + lVar5) = 0;
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != -8);
  local_c8.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_01399e20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_c8.mapScripts._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_c8.mapKeys._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(set)
{
    // Test the CScript::Set* methods
    FillableSigningProvider keystore;
    CKey key[4];
    std::vector<CPubKey> keys;
    keys.reserve(4);
    for (int i = 0; i < 4; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
        keys.push_back(key[i].GetPubKey());
    }

    CScript inner[4];
    inner[0] = GetScriptForDestination(PKHash(key[0].GetPubKey()));
    inner[1] = GetScriptForMultisig(2, std::vector<CPubKey>(keys.begin(), keys.begin()+2));
    inner[2] = GetScriptForMultisig(1, std::vector<CPubKey>(keys.begin(), keys.begin()+2));
    inner[3] = GetScriptForMultisig(2, std::vector<CPubKey>(keys.begin(), keys.begin()+3));

    CScript outer[4];
    for (int i = 0; i < 4; i++)
    {
        outer[i] = GetScriptForDestination(ScriptHash(inner[i]));
        BOOST_CHECK(keystore.AddCScript(inner[i]));
    }

    CMutableTransaction txFrom;  // Funding transaction:
    std::string reason;
    txFrom.vout.resize(4);
    for (int i = 0; i < 4; i++)
    {
        txFrom.vout[i].scriptPubKey = outer[i];
        txFrom.vout[i].nValue = CENT;
    }
    BOOST_CHECK(IsStandardTx(CTransaction(txFrom), reason));

    CMutableTransaction txTo[4]; // Spending transactions
    for (int i = 0; i < 4; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1*CENT;
        txTo[i].vout[0].scriptPubKey = inner[i];
    }
    for (int i = 0; i < 4; i++)
    {
        SignatureData empty;
        BOOST_CHECK_MESSAGE(SignSignature(keystore, CTransaction(txFrom), txTo[i], 0, SIGHASH_ALL, empty), strprintf("SignSignature %d", i));
        BOOST_CHECK_MESSAGE(IsStandardTx(CTransaction(txTo[i]), /*permit_bare_multisig=*/true, reason), strprintf("txTo[%d].IsStandard", i));
        bool no_pbms_is_std = IsStandardTx(CTransaction(txTo[i]), /*permit_bare_multisig=*/false, reason);
        BOOST_CHECK_MESSAGE((i == 0 ? no_pbms_is_std : !no_pbms_is_std), strprintf("txTo[%d].IsStandard(permbaremulti=false)", i));
    }
}